

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O2

sptr_t wal_write_mips(sptr_t buf,image_data_conflict *im,size_t mips,uint32_t *offsets)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  size_t n;
  long lVar5;
  uchar *puVar6;
  ulong uVar7;
  sptr_t sVar8;
  uchar *out;
  
  out = buf.ptr;
  uVar1 = im->width;
  uVar2 = im->height;
  n = 0;
  for (sVar4 = 0; sVar4 != mips; sVar4 = sVar4 + 1) {
    offsets[sVar4] = (uint32_t)n;
    puVar6 = (im->pixels).ptr;
    lVar5 = (long)(1 << ((byte)sVar4 & 0x1f));
    for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + lVar5) {
      for (uVar7 = 0; uVar7 < uVar1; uVar7 = uVar7 + lVar5) {
        write_8(puVar6[uVar7],&out);
        n = n + 1;
      }
      puVar6 = puVar6 + (ulong)uVar1 * lVar5;
    }
  }
  sVar8 = sptr_advance(buf,n);
  return sVar8;
}

Assistant:

static sptr_t wal_write_mips(sptr_t buf, const struct image_data *im,
							 size_t mips, uint32_t *offsets)
{
	int mip_num, x, y;
	size_t bytes_written = 0, width = im->width, height = im->height;
	unsigned char *ptr = NULL;
	unsigned char *out = buf.ptr;
	for (mip_num = 0; mip_num < mips; mip_num++) {
		offsets[mip_num] = bytes_written;
		ptr = im->pixels.ptr;
		for (y = 0; y < height; y += 1 << mip_num) {
			for (x = 0; x < width; x += 1 << mip_num) {
				write_8(ptr[x + width * y], &out);
				bytes_written++;
			}
		}
	}
	return sptr_advance(buf, bytes_written);
}